

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::DictVectorizer::SerializeWithCachedSizes
          (DictVectorizer *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  DictVectorizer *this_local;
  
  bVar1 = has_stringtoindex(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->Map_).stringtoindex_)->super_MessageLite,output);
  }
  bVar1 = has_int64toindex(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->Map_).stringtoindex_)->super_MessageLite,output);
  }
  return;
}

Assistant:

void DictVectorizer::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.DictVectorizer)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.StringVector stringToIndex = 1;
  if (has_stringtoindex()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *Map_.stringtoindex_, output);
  }

  // .CoreML.Specification.Int64Vector int64ToIndex = 2;
  if (has_int64toindex()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *Map_.int64toindex_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.DictVectorizer)
}